

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tztrans.cpp
# Opt level: O1

int __thiscall
icu_63::TimeZoneTransition::clone
          (TimeZoneTransition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeZoneTransition *this_00;
  
  this_00 = (TimeZoneTransition *)UMemory::operator_new((UMemory *)0x20,(size_t)__fn);
  if (this_00 == (TimeZoneTransition *)0x0) {
    this_00 = (TimeZoneTransition *)0x0;
  }
  else {
    TimeZoneTransition(this_00,this);
  }
  return (int)this_00;
}

Assistant:

TimeZoneTransition*
TimeZoneTransition::clone(void) const {
    return new TimeZoneTransition(*this);
}